

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

char * __thiscall cmGeneratorTarget::GetLocationForBuild(cmGeneratorTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmTarget *this_00;
  cmMakefile *this_01;
  bool bVar3;
  char *pcVar4;
  string macdir;
  string local_88;
  string local_68;
  string local_48;
  
  if (GetLocationForBuild()::location_abi_cxx11_ == '\0') {
    GetLocationForBuild();
  }
  bVar3 = cmTarget::IsImported(this->Target);
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (bVar3) {
    this_00 = this->Target;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    cmTarget::ImportedGetFullPath(&local_88,this_00,&local_68,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)&GetLocationForBuild()::location_abi_cxx11_,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_00285713;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    GetDirectory(&local_88,this,&local_68,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)&GetLocationForBuild()::location_abi_cxx11_,(string *)&local_88);
    paVar2 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    this_01 = this->Makefile;
    local_88._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_CFG_INTDIR","");
    pcVar4 = cmMakefile::GetDefinition(this_01,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar4 != (char *)0x0) && ((*pcVar4 != '.' || (pcVar4[1] != '\0')))) {
      std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
      std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
    }
    bVar3 = IsAppBundleOnApple(this);
    if (bVar3) {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
      BuildBundleDirectory(&local_88,this,&local_68,&local_48,FullLevel);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_88._M_string_length != 0) {
        std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
        std::__cxx11::string::_M_append
                  ((char *)&GetLocationForBuild()::location_abi_cxx11_,
                   (ulong)local_88._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    GetFullName(&local_88,this,&local_68,RuntimeBinaryArtifact);
    std::__cxx11::string::_M_append
              ((char *)&GetLocationForBuild()::location_abi_cxx11_,(ulong)local_88._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == paVar2) goto LAB_00285713;
  }
  operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
LAB_00285713:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return GetLocationForBuild()::location_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* cmGeneratorTarget::GetLocationForBuild() const
{
  static std::string location;
  if (this->IsImported()) {
    location = this->Target->ImportedGetFullPath(
      "", cmStateEnums::RuntimeBinaryArtifact);
    return location.c_str();
  }

  // Now handle the deprecated build-time configuration location.
  location = this->GetDirectory();
  const char* cfgid = this->Makefile->GetDefinition("CMAKE_CFG_INTDIR");
  if (cfgid && strcmp(cfgid, ".") != 0) {
    location += "/";
    location += cfgid;
  }

  if (this->IsAppBundleOnApple()) {
    std::string macdir = this->BuildBundleDirectory("", "", FullLevel);
    if (!macdir.empty()) {
      location += "/";
      location += macdir;
    }
  }
  location += "/";
  location += this->GetFullName("", cmStateEnums::RuntimeBinaryArtifact);
  return location.c_str();
}